

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O3

FT_UShort FT_Stream_GetUShortLE(FT_Stream stream)

{
  FT_UShort FVar1;
  FT_UShort *pFVar2;
  
  pFVar2 = (FT_UShort *)stream->cursor;
  if ((uchar *)((long)pFVar2 + 1U) < stream->limit) {
    FVar1 = *pFVar2;
    pFVar2 = pFVar2 + 1;
  }
  else {
    FVar1 = 0;
  }
  stream->cursor = (uchar *)pFVar2;
  return FVar1;
}

Assistant:

FT_BASE_DEF( FT_UShort )
  FT_Stream_GetUShortLE( FT_Stream  stream )
  {
    FT_Byte*   p;
    FT_UShort  result;


    FT_ASSERT( stream && stream->cursor );

    result         = 0;
    p              = stream->cursor;
    if ( p + 1 < stream->limit )
      result       = FT_NEXT_USHORT_LE( p );
    stream->cursor = p;

    return result;
  }